

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float128 float128_sqrt_mipsel(float128 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  byte bVar5;
  uint32_t aLow_1;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t bLow;
  ulong uVar15;
  ulong uVar16;
  uint32_t aLow;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  float128 fVar23;
  int32_t aExp;
  uint64_t aSig0;
  uint64_t aSig1;
  uint local_44;
  ulong local_40;
  uint64_t local_38;
  byte bVar6;
  
  uVar7 = a.high;
  local_38 = a.low;
  local_40 = uVar7 & 0xffffffffffff;
  local_44 = a.high._6_2_ & 0x7fff;
  if (local_44 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_38 != 0) {
      fVar23 = propagateFloat128NaN(a,a,status);
      return fVar23;
    }
    if (-1 < (long)uVar7) {
      return a;
    }
LAB_007d0889:
    status->float_exception_flags = status->float_exception_flags | 1;
    uVar7 = 0x2000000000000000;
    if (status->snan_bit_is_one != '\0') {
      uVar7 = 0x1fffffffffffffff;
    }
    fVar23.high = uVar7 >> 0xe | 0x7fff000000000000;
    fVar23.low = -(ulong)((uint)uVar7 & 1);
    return fVar23;
  }
  if ((long)uVar7 < 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_38 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
      return a;
    }
    goto LAB_007d0889;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_38 == 0) {
      return (float128)ZEXT816(0);
    }
    normalizeFloat128Subnormal(local_40,local_38,(int32_t *)&local_44,&local_40,&local_38);
  }
  uVar7 = (local_40 | 0x1000000000000) >> 0x11;
  uVar17 = (uint)(local_40 >> 0x20);
  if ((local_44 & 1) == 0) {
    uVar12 = ((uVar17 & 0x1fffc | 0x10000) >> 2 | 0x8000) -
             (uint)*(ushort *)
                    (estimateSqrt32_sqrtEvenAdjustments + (ulong)((uVar17 & 0xf000) >> 0xc) * 2);
    uVar12 = (int)(((local_40 & 0x1fffffffe0000 | 0x1000000000000) >> 0x11) / (ulong)uVar12) +
             uVar12;
    uVar17 = 0xffff8000;
    if (uVar12 < 0x20000) {
      uVar17 = uVar12 * 0x8000;
    }
    if (uVar17 <= (uint)uVar7) {
      uVar17 = (int)(uint)uVar7 >> 1;
      goto LAB_007d0915;
    }
  }
  else {
    uVar17 = (((uVar17 & 0x1fffc | 0x10000) >> 2) -
             (uint)*(ushort *)
                    (estimateSqrt32_sqrtOddAdjustments + (ulong)((uVar17 & 0xf000) >> 0xc) * 2)) +
             0x4000;
    uVar17 = uVar17 * 0x8000 +
             (int)(((local_40 & 0x1fffffffe0000 | 0x1000000000000) >> 0x11) / (ulong)uVar17) *
             0x4000;
    uVar7 = (local_40 & 0x1fffffffc0000 | 0x1000000000000) >> 0x12;
  }
  uVar17 = (uVar17 >> 1) + (int)(((uVar7 & 0xffffffff) << 0x1f) / (ulong)uVar17);
LAB_007d0915:
  bVar6 = (byte)(local_44 & 1);
  bVar5 = bVar6 ^ 0xd;
  uVar13 = local_38 << bVar5;
  uVar14 = CONCAT44(0,uVar17);
  local_40 = local_38 >> (bVar6 + 0x33 & 0x3f) | (local_40 | 0x1000000000000) << bVar5;
  uVar7 = 0xffffffffffffffff;
  if (local_40 < uVar14 << 0x20) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar14;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_40;
    uVar15 = SUB168(auVar2 / auVar1,0) << 0x20;
    for (lVar3 = local_40 - SUB164(auVar2 / auVar1,0) * uVar14; lVar3 < 0; lVar3 = lVar3 + uVar14) {
      uVar15 = uVar15 - 0x100000000;
    }
    uVar7 = lVar3 << 0x20 | uVar13 >> 0x20;
    if (uVar7 < uVar14 << 0x20) {
      uVar7 = uVar7 / uVar14;
    }
    else {
      uVar7 = 0xffffffff;
    }
    uVar7 = uVar7 | uVar15;
  }
  uVar7 = uVar14 * 0x40000000 + uVar7;
  uVar15 = uVar7 >> 0x20;
  uVar8 = (uVar7 & 0xffffffff) * uVar15;
  uVar16 = uVar8 >> 0x1f;
  uVar18 = uVar7 * uVar7;
  uVar14 = uVar13 - uVar18;
  lVar3 = ((local_40 - (uVar13 < uVar18)) -
          ((uVar16 & 0xffffffff) + uVar15 * uVar15 + (uVar16 & 0x100000000))) -
          (ulong)(uVar18 < uVar8 << 0x21);
  uVar15 = uVar7 * 2;
  for (; lVar3 < 0; lVar3 = (lVar3 - ((long)uVar7 >> 0x3f)) + (ulong)bVar21) {
    uVar7 = uVar7 - 1;
    bVar21 = CARRY8(uVar14,uVar15 - 1);
    uVar14 = uVar14 + (uVar15 - 1);
    uVar15 = uVar15 - 2;
  }
  uVar8 = 0xffffffffffffffff;
  if (uVar14 < uVar15) {
    uVar16 = uVar15 >> 0x20;
    uVar18 = 0xffffffff00000000;
    if (uVar14 < (uVar15 & 0xffffffff00000000)) {
      uVar18 = uVar14 / uVar16 << 0x20;
    }
    uVar20 = (uVar15 & 0xffffffff) * (uVar18 >> 0x20);
    uVar4 = uVar18 * uVar15;
    uVar8 = -uVar4;
    lVar3 = ((uVar14 - ((uVar20 >> 0x20) + (uVar18 >> 0x20) * uVar16)) - (ulong)(uVar4 != 0)) -
            (ulong)(uVar4 < uVar20 << 0x20);
    if (lVar3 < 0) {
      uVar4 = (0x100000000 - uVar18) * uVar15;
      uVar20 = uVar8;
      do {
        uVar18 = uVar18 - 0x100000000;
        uVar8 = uVar20 + (uVar15 << 0x20);
        bVar21 = uVar4 < uVar20;
        uVar4 = uVar4 + (uVar15 << 0x20);
        lVar3 = lVar3 + uVar16 + (ulong)bVar21;
        uVar20 = uVar8;
      } while (lVar3 < 0);
    }
    uVar8 = uVar8 >> 0x20 | lVar3 << 0x20;
    if (uVar8 < (uVar15 & 0xffffffff00000000)) {
      uVar8 = uVar8 / uVar16;
    }
    else {
      uVar8 = 0xffffffff;
    }
    uVar8 = uVar8 | uVar18;
  }
  if (((uint)uVar8 & 0x1ffe) < 6) {
    uVar8 = uVar8 + (uVar8 == 0);
    uVar18 = uVar8 >> 0x20;
    uVar16 = (uVar15 & 0xffffffff) * uVar18;
    uVar4 = (uVar8 & 0xffffffff) * (uVar15 >> 0x20);
    lVar3 = 0;
    uVar20 = uVar4 + uVar16;
    if (CARRY8(uVar4,uVar16)) {
      lVar3 = -0x100000000;
    }
    uVar16 = uVar8 * uVar15;
    uVar19 = (uVar8 & 0xffffffff) * uVar18;
    uVar4 = uVar19 >> 0x1f;
    uVar9 = uVar8 * uVar8;
    uVar11 = (uVar4 & 0xffffffff) + uVar18 * uVar18 + (uVar4 & 0x100000000) +
             (ulong)(uVar9 < uVar19 << 0x21);
    uVar4 = -uVar16 - uVar11;
    uVar10 = -uVar9;
    uVar19 = uVar4 - (uVar9 != 0);
    lVar3 = (((((uVar14 - (uVar16 != 0)) - ((uVar20 >> 0x20) + (uVar15 >> 0x20) * uVar18)) + lVar3)
             - (ulong)(uVar16 < uVar20 << 0x20)) - (ulong)(-uVar16 < uVar11)) -
            (ulong)(uVar4 < (uVar9 != 0));
    if (lVar3 < 0) {
      uVar14 = uVar8 * 2 - 1;
      do {
        uVar8 = uVar8 - 1;
        uVar16 = uVar8 >> 0x3f | uVar15;
        bVar21 = CARRY8(uVar10,uVar14);
        uVar10 = uVar10 + uVar14;
        bVar22 = CARRY8(uVar19,uVar16);
        uVar16 = uVar19 + uVar16;
        uVar19 = uVar16 + bVar21;
        lVar3 = lVar3 + (ulong)(bVar22 || CARRY8(uVar16,(ulong)bVar21));
        uVar14 = uVar14 - 2;
      } while (lVar3 < 0);
    }
    uVar8 = uVar8 | ((lVar3 != 0 || uVar19 != 0) || uVar10 != 0);
  }
  local_38 = uVar13;
  fVar23 = roundAndPackFloat128
                     ('\0',((int)(local_44 - 0x3fff) >> 1) + 0x3ffe,uVar7 >> 0xe,
                      uVar7 << 0x32 | uVar8 >> 0xe,uVar8 << 0x32,status);
  return fVar23;
}

Assistant:

float128 float128_sqrt(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, zSig2, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( 0, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFE;
    aSig0 |= UINT64_C(0x0001000000000000);
    zSig0 = estimateSqrt32( aExp, aSig0>>17 );
    shortShift128Left( aSig0, aSig1, 13 - ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & 0x1FFF ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 14, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(0, zExp, zSig0, zSig1, zSig2, status);

}